

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 param_15,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len)

{
  mz_zip_internal_state *pArray;
  size_t sVar1;
  mz_bool mVar2;
  ulong uVar3;
  mz_uint64 mVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  size_t orig_size;
  undefined1 uVar6;
  ulong uVar7;
  mz_uint32 central_dir_ofs;
  undefined8 local_98;
  mz_uint16 mStack_90;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  mz_uint32 local_88;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  mz_uint16 mStack_7c;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  mz_uint16 local_78;
  undefined4 uStack_76;
  mz_uint32 local_72;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined4 local_68;
  undefined4 local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  char *local_38;
  
  pArray = pZip->m_pState;
  uVar5 = (pArray->m_central_dir).m_size;
  local_64 = (undefined4)uVar5;
  if ((param_15 >> 0x20 != 0) && (pArray->m_zip64 == 0)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_FILE_TOO_LARGE;
    return 0;
  }
  uVar3 = (ulong)filename_size;
  local_50 = (ulong)extra_size;
  local_58 = (ulong)user_extra_data_len;
  local_68 = (undefined4)CONCAT62(in_register_00000012,filename_size);
  local_60 = (ulong)comment_size;
  if (0xfffffffe < local_50 + uVar3 + local_60 + local_58 + uVar5 + 0x2e) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  uVar6 = 0x14;
  if (method == 0) {
    uVar6 = 0;
  }
  uStack_76 = 0;
  local_98 = (ulong)CONCAT16(uVar6,0x2014b50);
  _mStack_90 = CONCAT17((char)(dos_date >> 8),
                        CONCAT16((char)dos_date,
                                 CONCAT15((char)(dos_time >> 8),
                                          CONCAT14((char)dos_time,
                                                   CONCAT13((char)(method >> 8),
                                                            CONCAT12((char)method,bit_flags))))));
  if (0xfffffffe < comp_size) {
    comp_size = 0xffffffff;
  }
  _local_88 = CONCAT17((char)(comp_size >> 0x18),
                       CONCAT16((char)(comp_size >> 0x10),
                                CONCAT15((char)(comp_size >> 8),
                                         CONCAT14((char)comp_size,uncomp_crc32))));
  if (0xfffffffe < uncomp_size) {
    uncomp_size = 0xffffffff;
  }
  uStack_80 = (undefined1)uncomp_size;
  uStack_7f = (undefined1)(uncomp_size >> 8);
  uStack_7e = (undefined1)(uncomp_size >> 0x10);
  uStack_7d = (undefined1)(uncomp_size >> 0x18);
  uStack_7a = (undefined1)(user_extra_data_len + extra_size);
  uStack_79 = (undefined1)(user_extra_data_len + extra_size >> 8);
  mVar4 = 0xffffffff;
  if (param_15 < 0xffffffff) {
    mVar4 = param_15;
  }
  _local_72 = CONCAT17((char)(mVar4 >> 0x18),
                       CONCAT16((char)(mVar4 >> 0x10),
                                CONCAT15((char)(mVar4 >> 8),CONCAT14((char)mVar4,ext_attributes))));
  uVar7 = uVar5 + 0x2e;
  local_48 = pComment;
  local_40 = pExtra;
  local_38 = pFilename;
  if ((pArray->m_central_dir).m_capacity < uVar7) {
    local_78 = comment_size;
    mStack_7c = filename_size;
    mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar7,1);
    comment_size = local_78;
    filename_size = mStack_7c;
    if (mVar2 != 0) goto LAB_0014cf72;
  }
  else {
LAB_0014cf72:
    (pArray->m_central_dir).m_size = uVar7;
    uVar7 = (ulong)(pArray->m_central_dir).m_element_size;
    local_78 = comment_size;
    mStack_7c = filename_size;
    memcpy((void *)(uVar5 * uVar7 + (long)(pArray->m_central_dir).m_p),&local_98,uVar7 * 0x2e);
    sVar1 = (pArray->m_central_dir).m_size;
    uVar7 = sVar1 + uVar3;
    if ((pArray->m_central_dir).m_capacity < uVar7) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar7,1);
      if (mVar2 == 0) goto LAB_0014d121;
    }
    (pArray->m_central_dir).m_size = uVar7;
    uVar7 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar1 * uVar7 + (long)(pArray->m_central_dir).m_p),local_38,uVar3 * uVar7);
    sVar1 = (pArray->m_central_dir).m_size;
    uVar3 = local_50 + sVar1;
    if ((pArray->m_central_dir).m_capacity < uVar3) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1);
      if (mVar2 == 0) goto LAB_0014d121;
    }
    (pArray->m_central_dir).m_size = uVar3;
    uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),local_40,local_50 * uVar3);
    sVar1 = (pArray->m_central_dir).m_size;
    uVar3 = sVar1 + local_58;
    if ((pArray->m_central_dir).m_capacity < uVar3) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1);
      if (mVar2 == 0) goto LAB_0014d121;
    }
    (pArray->m_central_dir).m_size = uVar3;
    uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),user_extra_data,
           local_58 * uVar3);
    sVar1 = (pArray->m_central_dir).m_size;
    uVar3 = sVar1 + local_60;
    if ((pArray->m_central_dir).m_capacity < uVar3) {
      mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar3,1);
      if (mVar2 == 0) goto LAB_0014d121;
    }
    (pArray->m_central_dir).m_size = uVar3;
    uVar3 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar1 * uVar3 + (long)(pArray->m_central_dir).m_p),local_48,local_60 * uVar3);
    sVar1 = (pArray->m_central_dir_offsets).m_size;
    uVar3 = sVar1 + 1;
    if (uVar3 <= (pArray->m_central_dir_offsets).m_capacity) {
LAB_0014d0fd:
      (pArray->m_central_dir_offsets).m_size = uVar3;
      uVar5 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
      memcpy((void *)(sVar1 * uVar5 + (long)(pArray->m_central_dir_offsets).m_p),&local_64,uVar5);
      return 1;
    }
    mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar3,1);
    if (mVar2 != 0) goto LAB_0014d0fd;
  }
LAB_0014d121:
  if ((pArray->m_central_dir).m_capacity < uVar5) {
    mVar2 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar5,0);
    if (mVar2 == 0) goto LAB_0014d13f;
  }
  (pArray->m_central_dir).m_size = uVar5;
LAB_0014d13f:
  if (pZip != (mz_zip_archive *)0x0) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
                                                const void *pExtra, mz_uint16 extra_size, const void *pComment, mz_uint16 comment_size,
                                                mz_uint64 uncomp_size, mz_uint64 comp_size, mz_uint32 uncomp_crc32,
                                                mz_uint16 method, mz_uint16 bit_flags, mz_uint16 dos_time, mz_uint16 dos_date,
                                                mz_uint64 local_header_ofs, mz_uint32 ext_attributes,
                                                const char *user_extra_data, mz_uint user_extra_data_len)
{
    mz_zip_internal_state *pState = pZip->m_pState;
    mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
    size_t orig_central_dir_size = pState->m_central_dir.m_size;
    mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

    if (!pZip->m_pState->m_zip64)
    {
        if (local_header_ofs > 0xFFFFFFFF)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
    }

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size + user_extra_data_len + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!mz_zip_writer_create_central_dir_header(pZip, central_dir_header, filename_size, extra_size + user_extra_data_len, comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_header_ofs, ext_attributes))
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename, filename_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra, extra_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, user_extra_data, user_extra_data_len)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment, comment_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &central_dir_ofs, 1)))
    {
        /* Try to resize the central directory array back into its original state. */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    return MZ_TRUE;
}